

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O2

Result __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdge
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,Target *target,Options *options)

{
  S2LogMessage SStack_18;
  
  if (options->max_results_ == 1) {
    FindClosestEdgesInternal(this,target,options);
    return this->result_singleton_;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
             ,0x20b,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Check failed: (options.max_results()) == (1) ");
  abort();
}

Assistant:

typename S2ClosestEdgeQueryBase<Distance>::Result
S2ClosestEdgeQueryBase<Distance>::FindClosestEdge(Target* target,
                                                  const Options& options) {
  S2_DCHECK_EQ(options.max_results(), 1);
  FindClosestEdgesInternal(target, options);
  return result_singleton_;
}